

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,Expr *expr)

{
  Expr *expr_local;
  DebugInfoVisitor *this_local;
  
  add_info(this,&expr->super_Var);
  return;
}

Assistant:

void visit(Expr *expr) override { add_info(expr); }